

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoprism.h
# Opt level: O2

void pzgeom::TPZGeoPrism::X<double>(TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZVec<double> *x)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  ulong uVar4;
  int j;
  long row;
  ulong uVar5;
  double extraout_XMM0_Qa;
  TPZFNMatrix<6,_double> phi;
  TPZFNMatrix<18,_double> dphi;
  
  TPZFNMatrix<6,_double>::TPZFNMatrix(&phi,6,1);
  TPZFNMatrix<18,_double>::TPZFNMatrix(&dphi,3,6);
  pztopology::TPZPrism::TShape<double>
            (loc,&phi.super_TPZFMatrix<double>,&dphi.super_TPZFMatrix<double>);
  uVar2 = (uint)(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  uVar5 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    x->fStore[uVar5] = 0.0;
    for (row = 0; row != 6; row = row + 1) {
      pdVar3 = TPZFMatrix<double>::operator()(&phi.super_TPZFMatrix<double>,row,0);
      dVar1 = *pdVar3;
      (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
      )(nodes,uVar5,row);
      x->fStore[uVar5] = dVar1 * extraout_XMM0_Qa + x->fStore[uVar5];
    }
  }
  TPZFNMatrix<18,_double>::~TPZFNMatrix(&dphi);
  TPZFNMatrix<6,_double>::~TPZFNMatrix(&phi);
  return;
}

Assistant:

inline void TPZGeoPrism::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        TPZFNMatrix<6,T> phi(6,1);
        TPZFNMatrix<18,T> dphi(3,6);
        TShape(loc,phi,dphi);
        int space = nodes.Rows();
        
        for(int i = 0; i < space; i++) {
            x[i] = 0.0;
            for(int j = 0; j < 6; j++) {
                x[i] += phi(j,0)*nodes.GetVal(i,j);
            }
        }
    }